

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O1

void __thiscall google::protobuf::internal::ThreadSafeArena::~ThreadSafeArena(ThreadSafeArena *this)

{
  ulong uVar1;
  code *pcVar2;
  ulong uVar3;
  SizedPtr SVar4;
  
  CleanupList(this);
  SVar4 = Free(this);
  uVar3 = SVar4.n;
  uVar1 = (this->alloc_policy_).policy_;
  if (uVar3 != 0 && (uVar1 & 1) == 0) {
    uVar1 = uVar1 & 0xfffffffffffffff8;
    if (uVar1 == 0) {
      pcVar2 = (code *)0x0;
    }
    else {
      pcVar2 = *(code **)(uVar1 + 0x18);
    }
    if (pcVar2 == (code *)0x0) {
      operator_delete(SVar4.p,uVar3);
    }
    else {
      (*pcVar2)(SVar4.p,uVar3);
    }
  }
  absl::lts_20240722::Mutex::Dtor();
  return;
}

Assistant:

ThreadSafeArena::~ThreadSafeArena() {
  // Have to do this in a first pass, because some of the destructors might
  // refer to memory in other blocks.
  CleanupList();

  auto mem = Free();
  if (alloc_policy_.is_user_owned_initial_block()) {
    // Unpoison the initial block, now that it's going back to the user.
    PROTOBUF_UNPOISON_MEMORY_REGION(mem.p, mem.n);
  } else if (mem.n > 0) {
    GetDeallocator(alloc_policy_.get())(mem);
  }
}